

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::BindHitGroupForInstance
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,ITopLevelAS *pTLAS,
          char *pInstanceName,Uint32 RayOffsetInHitGroupIndex,char *pShaderGroupName,void *pData,
          Uint32 DataSize)

{
  byte bVar1;
  uint uVar2;
  RenderDeviceVkImpl *pRVar3;
  bool bVar4;
  undefined4 in_register_0000000c;
  char (*Args_1) [115];
  ulong uVar5;
  char (*Args_1_00) [96];
  IBottomLevelAS *pIVar6;
  long lVar7;
  ulong __new_size;
  ulong uVar8;
  TLASInstanceDesc TVar9;
  string local_90;
  Uint32 local_6c;
  ulong local_68;
  uint local_60;
  uint local_5c;
  void *local_58;
  TopLevelASImplType *local_50;
  ulong local_48;
  char (*local_40) [96];
  char *local_38;
  
  bVar4 = (DataSize != 0) != (pData == (void *)0x0);
  Args_1 = (char (*) [115])
           CONCAT71((int7)(CONCAT44(in_register_0000000c,RayOffsetInHitGroupIndex) >> 8),bVar4);
  local_6c = RayOffsetInHitGroupIndex;
  local_58 = pData;
  local_38 = pShaderGroupName;
  if (!bVar4) {
    FormatString<char[26],char[38]>
              (&local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) == (DataSize == 0)",(char (*) [38])Args_1);
    Args_1 = (char (*) [115])0xf6;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                      local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_58 != (void *)0x0) && (this->m_ShaderRecordSize != DataSize)) {
    FormatString<char[26],char[61]>
              (&local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"(pData == nullptr) || (DataSize == this->m_ShaderRecordSize)",
               (char (*) [61])Args_1);
    Args_1 = (char (*) [115])0xf7;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                      local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (pTLAS == (ITopLevelAS *)0x0) {
    FormatString<char[26],char[17]>
              (&local_90,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pTLAS != nullptr",
               (char (*) [17])Args_1);
    Args_1 = (char (*) [115])0xf8;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xf8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                      local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    CheckDynamicType<Diligent::TopLevelASVkImpl,Diligent::ITopLevelAS>(pTLAS);
  }
  local_68 = (ulong)*(uint *)&pTLAS[10].super_IDeviceObject.super_IObject._vptr_IObject;
  local_5c = *(uint *)&pTLAS[0xb].super_IDeviceObject.super_IObject._vptr_IObject;
  bVar1 = *(byte *)((long)&pTLAS[10].super_IDeviceObject.super_IObject._vptr_IObject + 4);
  local_60 = *(uint *)((long)&pTLAS[0xb].super_IDeviceObject.super_IObject._vptr_IObject + 4);
  TVar9 = TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
                    ((TopLevelASBase<Diligent::EngineVkImplTraits> *)pTLAS,pInstanceName);
  pIVar6 = TVar9.pBLAS;
  if (1 < bVar1) {
    FormatString<char[26],char[115]>
              (&local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_GEOMETRY || Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_INSTANCE"
               ,Args_1);
    Args_1 = (char (*) [115])0xff;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0xff);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                      local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((uint)local_68 <= local_6c) {
    FormatString<char[26],char[47]>
              (&local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"RayOffsetInHitGroupIndex < Info.HitGroupStride",(char (*) [47])Args_1
              );
    Args_1 = (char (*) [115])0x100;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                      local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (TVar9.ContributionToHitGroupIndex == 0xffffffff) {
    FormatString<char[26],char[50]>
              (&local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Desc.ContributionToHitGroupIndex != INVALID_INDEX",
               (char (*) [50])Args_1);
    Args_1 = (char (*) [115])0x101;
    DebugAssertionFailed
              ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x101);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                      local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (pIVar6 == (IBottomLevelAS *)0x0) {
    FormatString<char[26],char[22]>
              (&local_90,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Desc.pBLAS != nullptr",(char (*) [22])Args_1);
    DebugAssertionFailed
              ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
               "BindHitGroupForInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x102);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                      local_90.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = (uint)bVar1;
  local_50 = (TopLevelASImplType *)pTLAS;
  if (uVar2 != 1) {
    if (uVar2 == 0) {
      uVar2 = (*(pIVar6->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar6);
    }
    else {
      FormatString<char[21]>(&local_90,(char (*) [21])"unknown binding mode");
      DebugAssertionFailed
                ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                 "BindHitGroupForInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
                 ,0x10c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
          &local_90.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                        local_90.field_2._M_allocated_capacity + 1);
      }
      uVar2 = 0;
    }
  }
  uVar8 = (ulong)uVar2;
  lVar7 = uVar8 * local_68;
  pRVar3 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  local_40 = (char (*) [96])(ulong)this->m_ShaderRecordStride;
  uVar5 = (long)(this->m_HitGroupsRecord).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_HitGroupsRecord).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = (lVar7 + (TVar9._0_8_ & 0xffffffff)) * (long)local_40;
  if (__new_size < uVar5) {
    __new_size = uVar5;
  }
  local_48 = (ulong)(pRVar3->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                    ShaderGroupHandleSize;
  local_90._M_dataplus._M_p._0_1_ = 0xa7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_HitGroupsRecord,__new_size,(value_type_conflict4 *)&local_90);
  this->m_Changed = true;
  if (uVar2 != 0) {
    uVar2 = local_6c + TVar9.ContributionToHitGroupIndex;
    do {
      lVar7 = (ulong)uVar2 * (long)local_40;
      Args_1_00 = local_40;
      PipelineStateBase<Diligent::EngineVkImplTraits>::CopyShaderHandle
                (&((this->m_pPSO).m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                 local_38,(this->m_HitGroupsRecord).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar7,(size_t)local_40);
      memcpy((this->m_HitGroupsRecord).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + local_48 + lVar7,local_58,(ulong)DataSize);
      if ((uVar2 < local_5c) || (local_60 < uVar2)) {
        FormatString<char[26],char[96]>
                  (&local_90,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "Index >= Info.FirstContributionToHitGroupIndex && Index <= Info.LastContributionToHitGroupIndex"
                   ,Args_1_00);
        DebugAssertionFailed
                  ((Char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_)
                   ,"BindHitGroupForInstance",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
                   ,0x121);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_) !=
            &local_90.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_90._M_dataplus._M_p._1_7_,local_90._M_dataplus._M_p._0_1_),
                          local_90.field_2._M_allocated_capacity + 1);
        }
      }
      OnBindHitGroup(this,local_50,(ulong)uVar2);
      uVar2 = (int)local_68 + uVar2;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  return;
}

Assistant:

BindHitGroupForInstance(ITopLevelAS* pTLAS,
                                                    const char*  pInstanceName,
                                                    Uint32       RayOffsetInHitGroupIndex,
                                                    const char*  pShaderGroupName,
                                                    const void*  pData,
                                                    Uint32       DataSize) override final
    {
        VERIFY_EXPR((pData == nullptr) == (DataSize == 0));
        VERIFY_EXPR((pData == nullptr) || (DataSize == this->m_ShaderRecordSize));
        VERIFY_EXPR(pTLAS != nullptr);

        TopLevelASImplType* const pTLASImpl = ClassPtrCast<TopLevelASImplType>(pTLAS);
        const TLASBuildInfo       Info      = pTLASImpl->GetBuildInfo();
        const TLASInstanceDesc    Desc      = pTLASImpl->GetInstanceDesc(pInstanceName);

        VERIFY_EXPR(Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_GEOMETRY ||
                    Info.BindingMode == HIT_GROUP_BINDING_MODE_PER_INSTANCE);
        VERIFY_EXPR(RayOffsetInHitGroupIndex < Info.HitGroupStride);
        VERIFY_EXPR(Desc.ContributionToHitGroupIndex != INVALID_INDEX);
        VERIFY_EXPR(Desc.pBLAS != nullptr);

        const Uint32 InstanceOffset = Desc.ContributionToHitGroupIndex;
        Uint32       GeometryCount  = 0;

        switch (Info.BindingMode)
        {
            // clang-format off
            case HIT_GROUP_BINDING_MODE_PER_GEOMETRY:     GeometryCount = Desc.pBLAS->GetActualGeometryCount(); break;
            case HIT_GROUP_BINDING_MODE_PER_INSTANCE:     GeometryCount = 1;                                    break;
            default:                                      UNEXPECTED("unknown binding mode");
                // clang-format on
        }

        const Uint32 BeginIndex = InstanceOffset;
        const size_t EndIndex   = InstanceOffset + size_t{GeometryCount} * size_t{Info.HitGroupStride};
        const Uint32 GroupSize  = this->GetDevice()->GetAdapterInfo().RayTracing.ShaderGroupHandleSize;
        const size_t Stride     = this->m_ShaderRecordStride;

        this->m_HitGroupsRecord.resize(std::max(this->m_HitGroupsRecord.size(), EndIndex * Stride), Uint8{EmptyElem});
        this->m_Changed = true;

        for (Uint32 i = 0; i < GeometryCount; ++i)
        {
            Uint32 Index  = BeginIndex + i * Info.HitGroupStride + RayOffsetInHitGroupIndex;
            size_t Offset = Index * Stride;
            this->m_pPSO->CopyShaderHandle(pShaderGroupName, this->m_HitGroupsRecord.data() + Offset, Stride);

            std::memcpy(this->m_HitGroupsRecord.data() + Offset + GroupSize, pData, DataSize);

#ifdef DILIGENT_DEVELOPMENT
            VERIFY_EXPR(Index >= Info.FirstContributionToHitGroupIndex && Index <= Info.LastContributionToHitGroupIndex);
            OnBindHitGroup(pTLASImpl, Index);
#endif
        }
    }